

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_generic_fclose(mcpl_generic_filehandle_t *fh)

{
  long *in_RDI;
  
  if (*in_RDI == 0) {
    mcpl_error((char *)0x10a5eb);
  }
  if ((int)in_RDI[2] == 0) {
    fclose((FILE *)*in_RDI);
  }
  else {
    gzclose(*in_RDI);
  }
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[1] = 0;
  *in_RDI = 0;
  return;
}

Assistant:

void mcpl_generic_fclose( mcpl_generic_filehandle_t* fh )
{
  if ( !fh->internal )
    mcpl_error("Error trying to close invalid file handle");

  //NB: We only use 1 bit in mode flag for now, so we dont have to actually do
  //"fh->mode & 0x1" to test if it is gzipped.
  if ( fh->mode )
    gzclose((gzFile)(fh->internal));
  else
    fclose( (FILE*)(fh->internal) );

  fh->mode = 0;
  fh->current_pos = 0;
  fh->internal = NULL;
}